

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_queue_reader.c
# Opt level: O2

int main(void)

{
  key_t __key;
  int __msqid;
  
  __key = ftok("progfile",0x41);
  __msqid = msgget(__key,0x3b6);
  msgrcv(__msqid,&message,0x70,1,0);
  printf("Data Received is : %s \n");
  msgctl(__msqid,0,(msqid_ds *)0x0);
  return 0;
}

Assistant:

int main() 
{ 
    key_t key; 
    int msgid; 
  
    // ftok to generate unique key 
    key = ftok("progfile", 65); 
  
    // msgget creates a message queue 
    // and returns identifier 
    msgid = msgget(key, 0666 | IPC_CREAT); 
  
    // msgrcv to receive message 
    msgrcv(msgid, &message, sizeof(message), 1, 0); 
  
    // display the message 
    printf("Data Received is : %s \n",  
                    message.mesg_text); 
  
    // to destroy the message queue 
    msgctl(msgid, IPC_RMID, NULL); 
  
    return 0; 
}